

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::media_fragment::parse_moof(media_fragment *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  reference pt;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  value_type local_31;
  value_type local_30;
  value_type local_2f;
  value_type local_2e;
  undefined1 local_2d;
  undefined1 auStack_2c [3];
  char name [5];
  uint temp_off;
  uint8_t *ptr;
  uint64_t offset;
  uint64_t box_size;
  media_fragment *this_local;
  
  if ((this->moof_box_).size_ != 0) {
    ptr = (uint8_t *)0x8;
    register0x00000000 =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                   (&(this->moof_box_).box_data_,0);
    while (puVar3 = (uint8_t *)
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              (&(this->moof_box_).box_data_), ptr < puVar3) {
      _auStack_2c = 0;
      pt = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&(this->moof_box_).box_data_,(size_type)ptr);
      uVar2 = anon_unknown.dwarf_124a5::fmp4_read_uint32((char *)pt);
      offset = (uint64_t)uVar2;
      local_31 = (stack0xffffffffffffffd8 + 4)[(long)ptr];
      local_30 = (stack0xffffffffffffffd8 + 5)[(long)ptr];
      local_2f = (stack0xffffffffffffffd8 + 6)[(long)ptr];
      local_2e = (stack0xffffffffffffffd8 + 7)[(long)ptr];
      local_2d = 0;
      if (offset == 1) {
        _auStack_2c = 8;
        offset = anon_unknown.dwarf_124a5::fmp4_read_uint64
                           ((char *)(stack0xffffffffffffffd8 + (long)(ptr + 8)));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"mfhd",&local_59);
      bVar1 = f_compare_4cc((char *)&local_31,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      if (bVar1) {
        mfhd::parse(&this->mfhd_,(char *)(stack0xffffffffffffffd8 + (long)(ptr + _auStack_2c)));
        ptr = ptr + offset;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"trun",&local_91);
        bVar1 = f_compare_4cc((char *)&local_31,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
        if (bVar1) {
          trun::parse(&this->trun_,(char *)(stack0xffffffffffffffd8 + (long)(ptr + _auStack_2c)));
          ptr = ptr + offset;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"tfdt",&local_b9);
          bVar1 = f_compare_4cc((char *)&local_31,&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          std::allocator<char>::~allocator(&local_b9);
          if (bVar1) {
            tfdt::parse(&this->tfdt_,(char *)(stack0xffffffffffffffd8 + (long)(ptr + _auStack_2c)));
            ptr = ptr + offset;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"tfhd",&local_e1)
            ;
            bVar1 = f_compare_4cc((char *)&local_31,&local_e0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::allocator<char>::~allocator(&local_e1);
            if (bVar1) {
              tfhd::parse(&this->tfhd_,(char *)(stack0xffffffffffffffd8 + (long)(ptr + _auStack_2c))
                         );
              ptr = ptr + offset;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_108,"traf",&local_109);
              bVar1 = f_compare_4cc((char *)&local_31,&local_108);
              std::__cxx11::string::~string((string *)&local_108);
              std::allocator<char>::~allocator(&local_109);
              if (bVar1) {
                ptr = ptr + 8;
              }
              else {
                ptr = ptr + (offset & 0xffffffff);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void media_fragment::parse_moof()
	{
		if (!moof_box_.size_)
			return;

		uint64_t box_size = 0;
		uint64_t offset = 8;
		uint8_t * ptr = &moof_box_.box_data_[0];

		while (moof_box_.box_data_.size() > offset)
		{
			unsigned int temp_off = 0;
			box_size = (uint64_t)fmp4_read_uint32((char *)&moof_box_.box_data_[offset]);

			char name[5] = { (char)ptr[offset + 4],(char)ptr[offset + 5],(char)ptr[offset + 6],(char)ptr[offset + 7],'\0' };

			if (box_size == 1) // the box_size is a large size (should not happen in fmp4)
			{
				temp_off = 8;
				box_size = fmp4_read_uint64((char *)& ptr[offset + temp_off]);
			}

			if (f_compare_4cc(name,"mfhd"))
			{
				mfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				//cout << "mfhd size" << box_size << endl;
				continue;
			}

			if (f_compare_4cc(name,"trun"))
			{
				trun_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name,"tfdt"))
			{
				tfdt_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name,"tfhd"))
			{
				tfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			// cmaf style only one traf box per moof so we skip it
			if (f_compare_4cc(name, "traf"))
			{
				offset += 8;
			}
			else
				offset += (unsigned int)box_size;
		}
	}